

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-impl.cpp
# Opt level: O0

string * llama_format_tensor_shape_abi_cxx11_(vector<long,_std::allocator<long>_> *ne)

{
  _Vector_base<long,_std::allocator<long>_> *p_Var1;
  ulong uVar2;
  const_reference pvVar3;
  size_type sVar4;
  size_t sVar5;
  size_t sVar6;
  vector<long,_std::allocator<long>_> *in_RSI;
  string *in_RDI;
  size_t i;
  char buf [256];
  size_type in_stack_fffffffffffffe88;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffe90;
  vector<long,_std::allocator<long>_> *this;
  allocator<char> *__a;
  char *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  allocator<char> local_121;
  ulong local_120;
  vector<long,_std::allocator<long>_> local_118 [11];
  vector<long,_std::allocator<long>_> *local_10;
  
  __a = (allocator<char> *)local_118;
  local_10 = in_RSI;
  pvVar3 = std::vector<long,_std::allocator<long>_>::at
                     (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  snprintf((char *)__a,0x100,"%5ld",*pvVar3);
  local_120 = 1;
  while( true ) {
    uVar2 = local_120;
    sVar4 = std::vector<long,_std::allocator<long>_>::size(local_10);
    if (sVar4 <= uVar2) break;
    this = local_118;
    sVar5 = strlen((char *)local_118);
    p_Var1 = &this->super__Vector_base<long,_std::allocator<long>_>;
    sVar6 = strlen((char *)local_118);
    pvVar3 = std::vector<long,_std::allocator<long>_>::at(this,in_stack_fffffffffffffe88);
    snprintf((char *)((long)&(p_Var1->_M_impl).super__Vector_impl_data._M_start + sVar5),
             0x100 - sVar6,", %5ld",*pvVar3);
    local_120 = local_120 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,__a);
  std::allocator<char>::~allocator(&local_121);
  return in_RDI;
}

Assistant:

std::string llama_format_tensor_shape(const std::vector<int64_t> & ne) {
    char buf[256];
    snprintf(buf, sizeof(buf), "%5" PRId64, ne.at(0));
    for (size_t i = 1; i < ne.size(); i++) {
        snprintf(buf + strlen(buf), sizeof(buf) - strlen(buf), ", %5" PRId64, ne.at(i));
    }
    return buf;
}